

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::
DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody
          (DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test *this)

{
  pointer __last;
  pointer __last_00;
  Descriptor *pDVar1;
  size_type __n;
  pointer __result;
  thread *ptVar2;
  anon_class_32_4_a47d18ca_for__M_head_impl *extraout_RDX;
  anon_class_32_4_a47d18ca_for__M_head_impl *extraout_RDX_00;
  anon_class_32_4_a47d18ca_for__M_head_impl *__args;
  anon_class_32_4_a47d18ca_for__M_head_impl *extraout_RDX_01;
  anon_class_32_4_a47d18ca_for__M_head_impl *__args_00;
  thread *thread;
  pointer ptVar3;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  int iVar4;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  thread local_390 [2];
  Descriptor *local_380;
  int local_378;
  TestAllTypes message;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&message);
  pDVar1 = proto2_unittest::TestAllTypes::GetDescriptor();
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __args_00 = extraout_RDX;
  for (iVar4 = 0;
      __last = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish,
      ptVar3 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start, iVar4 < pDVar1->field_count_; iVar4 = iVar4 + 1) {
    local_390[0]._M_id._M_thread = (id)(id)this;
    local_380 = pDVar1;
    local_378 = iVar4;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                      (&threads,1,"vector::_M_realloc_insert");
      __last_00 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      ptVar3 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                            __n);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody()::__1>
                ((allocator_type *)(((long)__last - (long)ptVar3) + (long)__result),local_390,__args
                );
      ptVar2 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar3,__last,__result,(allocator<std::thread> *)&threads);
      ptVar2 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (__last,__last_00,ptVar2 + 1,(allocator<std::thread> *)&threads);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,ptVar3,
                 (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage - (long)ptVar3 >> 3);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __result + __n;
      __args_00 = extraout_RDX_01;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = __result;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody()::__1>
                ((allocator_type *)
                 threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_390,__args_00);
      ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
      __args_00 = extraout_RDX_00;
    }
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = ptVar2;
  }
  for (; ptVar3 != __last; ptVar3 = ptVar3 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  proto2_unittest::TestAllTypes::~TestAllTypes(&message);
  return;
}

Assistant:

TEST_F(DescriptorPoolMemoizationTest, MemoizeProjectionMultithreaded) {
  auto name_lambda = [](const FieldDescriptor* field) {
    return field->full_name();
  };
  proto2_unittest::TestAllTypes message;
  const Descriptor* descriptor = message.GetDescriptor();
  std::vector<std::thread> threads;
  for (int i = 0; i < descriptor->field_count(); ++i) {
    threads.emplace_back([this, name_lambda, descriptor, i]() {
      auto name = DescriptorPoolMemoizationTest::MemoizeProjection(
          descriptor->field(i), name_lambda);
      auto first_name = DescriptorPoolMemoizationTest::MemoizeProjection(
          descriptor->field(0), name_lambda);
      ASSERT_THAT(name, HasSubstr("proto2_unittest.TestAllTypes"));
      if (i != 0) {
        ASSERT_NE(name, "proto2_unittest.TestAllTypes.optional_int32");
      }
      ASSERT_EQ(first_name, "proto2_unittest.TestAllTypes.optional_int32");
    });
  }
  for (auto& thread : threads) {
    thread.join();
  }
}